

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptAsyncGenerator.h
# Opt level: O0

void __thiscall
Js::AsyncGeneratorCallbackFunction::MarshalCrossSite_TTDInflate
          (AsyncGeneratorCallbackFunction *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  AsyncGeneratorCallbackFunction *this_local;
  
  bVar2 = VirtualTableInfo<Js::AsyncGeneratorCallbackFunction>::HasVirtualTable(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptAsyncGenerator.h"
                                ,0x76,
                                "(VirtualTableInfo<AsyncGeneratorCallbackFunction>::HasVirtualTable(this))"
                                ,"Derived class need to define marshal");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  VirtualTableInfo<Js::CrossSiteObject<Js::AsyncGeneratorCallbackFunction>_>::SetVirtualTable(this);
  return;
}

Assistant:

AsyncGeneratorCallbackFunction(
        DynamicType* type,
        FunctionInfo* functionInfo,
        JavascriptAsyncGenerator* generator) :
            RuntimeFunction(type, functionInfo),
            generator(generator) {}